

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder * __thiscall
capnp::_::PointerBuilder::initStructList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementCount elementCount,
          StructSize elementSize)

{
  ElementCount elementCount_local;
  PointerBuilder *this_local;
  StructSize elementSize_local;
  
  WireHelpers::initStructListPointer
            (__return_storage_ptr__,this->pointer,this->segment,this->capTable,elementCount,
             elementSize,(BuilderArena *)0x0);
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::initStructList(ElementCount elementCount, StructSize elementSize) {
  return WireHelpers::initStructListPointer(pointer, segment, capTable, elementCount, elementSize);
}